

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall
kj::Path::evalWin32Impl
          (Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path,
          bool fromApi)

{
  String *pSVar1;
  RemoveConst<kj::String> **ppRVar2;
  ArrayDisposer *pAVar3;
  String *pSVar4;
  undefined8 *puVar5;
  char cVar6;
  byte *__n;
  size_t sVar7;
  ArrayDisposer **ppAVar8;
  char *c;
  void *pvVar9;
  long lVar10;
  byte bVar11;
  RemoveConst<kj::String> **ppRVar12;
  Vector<kj::String> *pVVar13;
  ulong uVar14;
  undefined1 *puVar15;
  char (*params) [3];
  char *__file;
  size_t sVar16;
  unsigned_long i;
  undefined1 *puVar17;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  Fault f_1;
  String ownPath;
  Fault f;
  StringPtr local_88;
  String local_78;
  RemoveConst<kj::String> **local_58;
  size_t sStack_50;
  RemoveConst<kj::String> **local_48;
  Fault local_38;
  
  ppRVar12 = (RemoveConst<kj::String> **)path.content.ptr;
  cVar6 = (char)path.content.size_;
  local_58 = (RemoveConst<kj::String> **)0x0;
  sStack_50 = 0;
  local_48 = (RemoveConst<kj::String> **)0x0;
  local_88.content.ptr = (char *)parts;
  local_88.content.size_ = (size_t)ppRVar12;
  if ((int)path.content.size_ == 0) {
    __n = (byte *)((long)ppRVar12 + -1);
    pvVar9 = memchr(parts,0x2f,(size_t)__n);
    if (pvVar9 != (void *)0x0) {
      heapString(&local_78,(char *)parts,(size_t)__n);
      sVar16 = sStack_50;
      ppRVar12 = local_58;
      if (local_58 != (RemoveConst<kj::String> **)0x0) {
        local_58 = (RemoveConst<kj::String> **)0x0;
        sStack_50 = 0;
        (*(code *)((*local_48)->content).ptr)(local_48,ppRVar12,1,sVar16,sVar16,0);
      }
      local_58 = (RemoveConst<kj::String> **)local_78.content.ptr;
      sStack_50 = local_78.content.size_;
      pVVar13 = (Vector<kj::String> *)((long)local_78.content.ptr + (local_78.content.size_ - 1));
      ppRVar12 = (RemoveConst<kj::String> **)local_78.content.ptr;
      if (local_78.content.size_ == 0) {
        ppRVar12 = (RemoveConst<kj::String> **)0x0;
      }
      local_48 = (RemoveConst<kj::String> **)local_78.content.disposer;
      if (local_78.content.size_ == 0) {
        pVVar13 = (Vector<kj::String> *)0x0;
      }
      for (; (Vector<kj::String> *)ppRVar12 != pVVar13;
          ppRVar12 = (RemoveConst<kj::String> **)((long)ppRVar12 + 1)) {
        if (*(byte *)ppRVar12 == 0x2f) {
          *(byte *)ppRVar12 = 0x5c;
        }
      }
      ppRVar12 = (RemoveConst<kj::String> **)local_78.content.ptr;
      if (local_78.content.size_ == 0) {
        ppRVar12 = (RemoveConst<kj::String> **)0x385fb3;
      }
      local_88.content.size_ = local_78.content.size_ + (local_78.content.size_ == 0);
      local_88.content.ptr = (char *)ppRVar12;
    }
    if (cVar6 != '\0') goto LAB_00357f02;
LAB_00357f1e:
    if ((local_88.content.size_ < (RemoveConst<kj::String> **)0x3) ||
       (ppRVar12 = (RemoveConst<kj::String> **)local_88.content.ptr,
       *(short *)local_88.content.ptr != 0x5c5c)) {
      if (((RemoveConst<kj::String> **)0x1 < local_88.content.size_) &&
         (ppRVar12 = (RemoveConst<kj::String> **)local_88.content.ptr, *local_88.content.ptr == 0x5c
         )) {
        if (cVar6 != '\0') {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                    ((Fault *)&local_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x177,FAILED,"!fromApi","\"parseWin32Api() requires absolute path\"",
                     (char (*) [39])"parseWin32Api() requires absolute path");
          _::Debug::Fault::fatal((Fault *)&local_78);
        }
        pSVar1 = (this->parts).ptr;
        lVar10 = (this->parts).size_ - (long)pSVar1;
        if (lVar10 == 0) {
LAB_00358025:
          if ((ulong)((lVar10 >> 3) * -0x5555555555555555) < 2) {
            _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
                      (&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x182,FAILED,(char *)0x0,"\"must specify drive letter\", path",
                       (char (*) [26])"must specify drive letter",&local_88);
            ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
            str<char_const(&)[3]>(&local_78,(kj *)"c:",params);
            pSVar1 = (String *)(this->parts).disposer;
            if ((String *)(this->parts).size_ == pSVar1) {
              pSVar4 = (this->parts).ptr;
              sVar16 = 4;
              if (pSVar1 != pSVar4) {
                sVar16 = ((long)pSVar1 - (long)pSVar4 >> 3) * 0x5555555555555556;
              }
              Vector<kj::String>::setCapacity((Vector<kj::String> *)this,sVar16);
            }
            puVar5 = (undefined8 *)(this->parts).size_;
            *puVar5 = local_78.content.ptr;
            puVar5[1] = local_78.content.size_;
            puVar5[2] = local_78.content.disposer;
            local_78.content.ptr = (char *)0x0;
            local_78.content.size_ = 0;
            (this->parts).size_ = (size_t)(puVar5 + 3);
            _::Debug::Fault::~Fault(&local_38);
            ppRVar12 = (RemoveConst<kj::String> **)local_78.content.disposer;
            goto LAB_00358077;
          }
          __file = (char *)0x2;
        }
        else {
          ppRVar2 = (RemoveConst<kj::String> **)(pSVar1->content).size_;
          ppRVar12 = ppRVar2;
          if (ppRVar2 != (RemoveConst<kj::String> **)0x0) {
            ppRVar12 = (RemoveConst<kj::String> **)(pSVar1->content).ptr;
          }
          if (((ppRVar2 != (RemoveConst<kj::String> **)0x3) ||
              (*(byte *)((long)ppRVar12 + 1) != 0x3a)) ||
             (uVar14 = CONCAT71((int7)((ulong)ppRVar12 >> 8),*(byte *)ppRVar12) & 0xffffffffffffffdf
             , bVar11 = (char)uVar14 + 0xbf,
             ppRVar12 = (RemoveConst<kj::String> **)CONCAT71((int7)(uVar14 >> 8),bVar11),
             0x19 < bVar11)) goto LAB_00358025;
          __file = (char *)0x1;
        }
        ArrayBuilder<kj::String>::truncate((ArrayBuilder<kj::String> *)this,__file,(__off_t)pSVar1);
        goto LAB_00358077;
      }
      puVar15 = (undefined1 *)
                ((long)&(((Vector<kj::String> *)(local_88.content.size_ + -0x20))->builder).disposer
                + 7);
      if ((((puVar15 != (undefined1 *)0x2) &&
           ((puVar15 < (undefined1 *)0x3 || (*(byte *)((long)local_88.content.ptr + 2) != 0x5c))))
          || (*(byte *)((long)local_88.content.ptr + 1) != 0x3a)) ||
         (ppRVar2 = (RemoveConst<kj::String> **)local_88.content.ptr,
         ppAVar8 = (ArrayDisposer **)local_88.content.size_,
         0x19 < (byte)((*local_88.content.ptr & 0xdfU) + 0xbf))) {
        if (cVar6 != '\0') {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                    ((Fault *)&local_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x18e,FAILED,"!fromApi","\"parseWin32Api() requires absolute path\"",
                     (char (*) [39])"parseWin32Api() requires absolute path");
          _::Debug::Fault::fatal((Fault *)&local_78);
        }
        goto LAB_00358077;
      }
    }
    else {
      ppRVar2 = (RemoveConst<kj::String> **)((long)local_88.content.ptr + 2);
      ppAVar8 = (ArrayDisposer **)
                ((long)&(((Vector<kj::String> *)(local_88.content.size_ + -0x20))->builder).disposer
                + 6);
    }
  }
  else {
LAB_00357f02:
    if ((local_88.content.size_ < (RemoveConst<kj::String> **)0x5) ||
       (ppRVar12 = (RemoveConst<kj::String> **)local_88.content.ptr,
       *(int *)local_88.content.ptr != 0x5c3f5c5c)) goto LAB_00357f1e;
    ppRVar2 = (RemoveConst<kj::String> **)((long)local_88.content.ptr + 4);
    ppAVar8 = (ArrayDisposer **)
              ((long)&(((Vector<kj::String> *)(local_88.content.size_ + -0x20))->builder).disposer +
              4);
    if (((undefined1 *)0x4 < ppAVar8) && (*(int *)ppRVar2 == 0x5c434e55)) {
      ppRVar12 = (RemoveConst<kj::String> **)((long)local_88.content.ptr + 8);
      ppRVar2 = ppRVar12;
      ppAVar8 = &(((Vector<kj::String> *)(local_88.content.size_ + -0x20))->builder).disposer;
    }
  }
  local_88.content.size_ = (size_t)ppAVar8;
  local_88.content.ptr = (char *)ppRVar2;
  ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
LAB_00358077:
  puVar15 = (undefined1 *)0x0;
  pVVar13 = (Vector<kj::String> *)(local_88.content.size_ + -0x20);
  if ((RemoveConst<kj::String> **)local_88.content.size_ != (RemoveConst<kj::String> **)0x1) {
    puVar17 = (undefined1 *)0x0;
    do {
      if (puVar17[(long)local_88.content.ptr] == '\\') {
        part.size_ = (size_t)ppRVar12;
        part.ptr = puVar17 + -(long)puVar15;
        evalPart(this,(Vector<kj::String> *)(puVar15 + (long)local_88.content.ptr),part);
        puVar15 = puVar17 + 1;
      }
      puVar17 = puVar17 + 1;
    } while ((undefined1 *)((long)&(pVVar13->builder).disposer + 7) != puVar17);
  }
  part_00.ptr = (byte *)(local_88.content.size_ + ~(ulong)puVar15);
  part_00.size_ = (size_t)ppRVar12;
  evalPart(this,(Vector<kj::String> *)(puVar15 + (long)local_88.content.ptr),part_00);
  pAVar3 = (ArrayDisposer *)(this->parts).size_;
  if (pAVar3 != (this->parts).disposer) {
    Vector<kj::String>::setCapacity
              ((Vector<kj::String> *)this,
               ((long)pAVar3 - (long)(this->parts).ptr >> 3) * -0x5555555555555555);
  }
  sVar7 = sStack_50;
  ppRVar12 = local_58;
  pSVar1 = (this->parts).ptr;
  sVar16 = (this->parts).size_;
  pSVar4 = this[1].parts.ptr;
  (this->parts).ptr = (String *)0x0;
  (this->parts).size_ = 0;
  (this->parts).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->parts).ptr = pSVar1;
  (__return_storage_ptr__->parts).size_ = ((long)(sVar16 - (long)pSVar1) >> 3) * -0x5555555555555555
  ;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)pSVar4;
  if (local_58 != (RemoveConst<kj::String> **)0x0) {
    local_58 = (RemoveConst<kj::String> **)0x0;
    sStack_50 = 0;
    (*(code *)((*local_48)->content).ptr)(local_48,ppRVar12,1,sVar7,sVar7,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::evalWin32Impl(Vector<String>&& parts, StringPtr path, bool fromApi) {
  // Convert all forward slashes to backslashes.
  String ownPath;
  if (!fromApi && path.findFirst('/') != nullptr) {
    ownPath = heapString(path);
    for (char& c: ownPath) {
      if (c == '/') c = '\\';
    }
    path = ownPath;
  }

  // Interpret various forms of absolute paths.
  if (fromApi && path.startsWith("\\\\?\\")) {
    path = path.slice(4);
    if (path.startsWith("UNC\\")) {
      path = path.slice(4);
    }

    // The path is absolute.
    parts.clear();
  } else if (path.startsWith("\\\\")) {
    // UNC path.
    path = path.slice(2);

    // This path is absolute. The first component is a server name.
    parts.clear();
  } else if (path.startsWith("\\")) {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");

    // Path is relative to the current drive / network share.
    if (parts.size() >= 1 && isWin32Drive(parts[0])) {
      // Leading \ interpreted as root of current drive.
      parts.truncate(1);
    } else if (parts.size() >= 2) {
      // Leading \ interpreted as root of current network share (which is indicated by the first
      // *two* components of the path).
      parts.truncate(2);
    } else {
      KJ_FAIL_REQUIRE("must specify drive letter", path) {
        // Recover by assuming C drive.
        parts.clear();
        parts.add(kj::str("c:"));
        break;
      }
    }
  } else if ((path.size() == 2 || (path.size() > 2 && path[2] == '\\')) &&
             isWin32Drive(path.slice(0, 2))) {
    // Starts with a drive letter.
    parts.clear();
  } else {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '\\') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}